

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventpoint.cpp
# Opt level: O1

void QMutableEventPoint::update(QEventPoint *other,QEventPoint *target)

{
  undefined8 uVar1;
  QEventPointPrivate *pQVar2;
  QEventPointPrivate *pQVar3;
  qreal qVar4;
  bool bVar5;
  qint64 qVar6;
  State SVar7;
  long in_FS_OFFSET;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  QPointF local_38;
  QPointF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  detach(target);
  pQVar2 = (other->d).d.ptr;
  if (pQVar2 == (QEventPointPrivate *)0x0) {
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    uVar8 = SUB84(pQVar2->pressure,0);
    uVar9 = (undefined4)((ulong)pQVar2->pressure >> 0x20);
  }
  pQVar3 = (target->d).d.ptr;
  pQVar3->pressure = (qreal)CONCAT44(uVar9,uVar8);
  if (pQVar2 == (QEventPointPrivate *)0x0) {
    SVar7 = Unknown;
  }
  else {
    SVar7 = pQVar2->state;
  }
  if (SVar7 == Released) {
    local_38.xp._0_4_ = 0;
    local_38.xp._4_4_ = 0;
    local_38.yp._0_4_ = 0;
    local_38.yp._4_4_ = 0;
    local_28.xp._0_4_ = 0;
    local_28.xp._4_4_ = 0;
    local_28.yp._0_4_ = 0;
    local_28.yp._4_4_ = 0;
    if (pQVar3 != (QEventPointPrivate *)0x0) {
      local_28.xp._0_4_ = *(undefined4 *)&(pQVar3->globalPos).xp;
      local_28.xp._4_4_ = *(undefined4 *)((long)&(pQVar3->globalPos).xp + 4);
      local_28.yp._0_4_ = *(undefined4 *)&(pQVar3->globalPos).yp;
      local_28.yp._4_4_ = *(undefined4 *)((long)&(pQVar3->globalPos).yp + 4);
    }
    if (pQVar2 != (QEventPointPrivate *)0x0) {
      local_38.xp._0_4_ = *(undefined4 *)&(pQVar2->globalPos).xp;
      local_38.xp._4_4_ = *(undefined4 *)((long)&(pQVar2->globalPos).xp + 4);
      local_38.yp._0_4_ = *(undefined4 *)&(pQVar2->globalPos).yp;
      local_38.yp._4_4_ = *(undefined4 *)((long)&(pQVar2->globalPos).yp + 4);
    }
    bVar5 = qFuzzyCompare(&local_28,&local_38);
    if (!bVar5) {
      pQVar2 = (target->d).d.ptr;
      if (pQVar2 == (QEventPointPrivate *)0x0) {
        uVar8 = 0;
        uVar9 = 0;
        uVar10 = 0;
        uVar11 = 0;
      }
      else {
        uVar8 = *(undefined4 *)&(pQVar2->globalPos).xp;
        uVar9 = *(undefined4 *)((long)&(pQVar2->globalPos).xp + 4);
        uVar10 = *(undefined4 *)&(pQVar2->globalPos).yp;
        uVar11 = *(undefined4 *)((long)&(pQVar2->globalPos).yp + 4);
      }
      *(undefined4 *)&(pQVar2->globalLastPos).xp = uVar8;
      *(undefined4 *)((long)&(pQVar2->globalLastPos).xp + 4) = uVar9;
      *(undefined4 *)&(pQVar2->globalLastPos).yp = uVar10;
      *(undefined4 *)((long)&(pQVar2->globalLastPos).yp + 4) = uVar11;
    }
    ((target->d).d.ptr)->pressure = 0.0;
  }
  else if (SVar7 == Pressed) {
    if (pQVar2 == (QEventPointPrivate *)0x0) {
      uVar10 = 0;
      uVar11 = 0;
      uVar12 = 0;
      uVar13 = 0;
      (pQVar3->globalPressPos).xp = 0.0;
      (pQVar3->globalPressPos).yp = 0.0;
    }
    else {
      qVar4 = (pQVar2->globalPos).yp;
      (pQVar3->globalPressPos).xp = (pQVar2->globalPos).xp;
      (pQVar3->globalPressPos).yp = qVar4;
      uVar10 = *(undefined4 *)&(pQVar2->globalPos).xp;
      uVar11 = *(undefined4 *)((long)&(pQVar2->globalPos).xp + 4);
      uVar12 = *(undefined4 *)&(pQVar2->globalPos).yp;
      uVar13 = *(undefined4 *)((long)&(pQVar2->globalPos).yp + 4);
    }
    *(undefined4 *)&(pQVar3->globalLastPos).xp = uVar10;
    *(undefined4 *)((long)&(pQVar3->globalLastPos).xp + 4) = uVar11;
    *(undefined4 *)&(pQVar3->globalLastPos).yp = uVar12;
    *(undefined4 *)((long)&(pQVar3->globalLastPos).yp + 4) = uVar13;
    if ((pQVar3 != (QEventPointPrivate *)0x0) &&
       ((double)CONCAT44(uVar9,uVar8) <= 0.0 && (double)CONCAT44(uVar9,uVar8) != 0.0)) {
      pQVar3->pressure = 1.0;
    }
  }
  else {
    local_38.xp._0_4_ = 0;
    local_38.xp._4_4_ = 0;
    local_38.yp._0_4_ = 0;
    local_38.yp._4_4_ = 0;
    local_28.xp._0_4_ = 0;
    local_28.xp._4_4_ = 0;
    local_28.yp._0_4_ = 0;
    local_28.yp._4_4_ = 0;
    if (pQVar3 != (QEventPointPrivate *)0x0) {
      local_28.xp._0_4_ = *(undefined4 *)&(pQVar3->globalPos).xp;
      local_28.xp._4_4_ = *(undefined4 *)((long)&(pQVar3->globalPos).xp + 4);
      local_28.yp._0_4_ = *(undefined4 *)&(pQVar3->globalPos).yp;
      local_28.yp._4_4_ = *(undefined4 *)((long)&(pQVar3->globalPos).yp + 4);
    }
    if (pQVar2 != (QEventPointPrivate *)0x0) {
      local_38.xp._0_4_ = *(undefined4 *)&(pQVar2->globalPos).xp;
      local_38.xp._4_4_ = *(undefined4 *)((long)&(pQVar2->globalPos).xp + 4);
      local_38.yp._0_4_ = *(undefined4 *)&(pQVar2->globalPos).yp;
      local_38.yp._4_4_ = *(undefined4 *)((long)&(pQVar2->globalPos).yp + 4);
    }
    bVar5 = qFuzzyCompare(&local_28,&local_38);
    if (!bVar5) {
      pQVar2 = (target->d).d.ptr;
      if (pQVar2 == (QEventPointPrivate *)0x0) {
        uVar8 = 0;
        uVar9 = 0;
        uVar10 = 0;
        uVar11 = 0;
      }
      else {
        uVar8 = *(undefined4 *)&(pQVar2->globalPos).xp;
        uVar9 = *(undefined4 *)((long)&(pQVar2->globalPos).xp + 4);
        uVar10 = *(undefined4 *)&(pQVar2->globalPos).yp;
        uVar11 = *(undefined4 *)((long)&(pQVar2->globalPos).yp + 4);
      }
      *(undefined4 *)&(pQVar2->globalLastPos).xp = uVar8;
      *(undefined4 *)((long)&(pQVar2->globalLastPos).xp + 4) = uVar9;
      *(undefined4 *)&(pQVar2->globalLastPos).yp = uVar10;
      *(undefined4 *)((long)&(pQVar2->globalLastPos).yp + 4) = uVar11;
    }
    pQVar2 = (target->d).d.ptr;
    if ((pQVar2 != (QEventPointPrivate *)0x0) &&
       (pQVar2->pressure <= 0.0 && pQVar2->pressure != 0.0)) {
      pQVar2->pressure = 1.0;
    }
  }
  pQVar2 = (other->d).d.ptr;
  if (pQVar2 == (QEventPointPrivate *)0x0) {
    SVar7 = Unknown;
  }
  else {
    SVar7 = pQVar2->state;
  }
  pQVar3 = (target->d).d.ptr;
  pQVar3->state = SVar7;
  if (pQVar2 == (QEventPointPrivate *)0x0) {
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    (pQVar3->pos).xp = 0.0;
    (pQVar3->pos).yp = 0.0;
  }
  else {
    qVar4 = (pQVar2->pos).yp;
    (pQVar3->pos).xp = (pQVar2->pos).xp;
    (pQVar3->pos).yp = qVar4;
    uVar8 = *(undefined4 *)&(pQVar2->scenePos).xp;
    uVar9 = *(undefined4 *)((long)&(pQVar2->scenePos).xp + 4);
    uVar10 = *(undefined4 *)&(pQVar2->scenePos).yp;
    uVar11 = *(undefined4 *)((long)&(pQVar2->scenePos).yp + 4);
  }
  *(undefined4 *)&(pQVar3->scenePos).xp = uVar8;
  *(undefined4 *)((long)&(pQVar3->scenePos).xp + 4) = uVar9;
  *(undefined4 *)&(pQVar3->scenePos).yp = uVar10;
  *(undefined4 *)((long)&(pQVar3->scenePos).yp + 4) = uVar11;
  if (pQVar2 == (QEventPointPrivate *)0x0) {
    (pQVar3->globalPos).xp = 0.0;
    (pQVar3->globalPos).yp = 0.0;
    uVar8 = 0;
    uVar9 = 0xbff00000;
    uVar10 = 0;
    uVar11 = 0xbff00000;
  }
  else {
    qVar4 = (pQVar2->globalPos).yp;
    (pQVar3->globalPos).xp = (pQVar2->globalPos).xp;
    (pQVar3->globalPos).yp = qVar4;
    uVar8 = *(undefined4 *)&(pQVar2->ellipseDiameters).wd;
    uVar9 = *(undefined4 *)((long)&(pQVar2->ellipseDiameters).wd + 4);
    uVar10 = *(undefined4 *)&(pQVar2->ellipseDiameters).ht;
    uVar11 = *(undefined4 *)((long)&(pQVar2->ellipseDiameters).ht + 4);
  }
  *(undefined4 *)&(pQVar3->ellipseDiameters).wd = uVar8;
  *(undefined4 *)((long)&(pQVar3->ellipseDiameters).wd + 4) = uVar9;
  *(undefined4 *)&(pQVar3->ellipseDiameters).ht = uVar10;
  *(undefined4 *)((long)&(pQVar3->ellipseDiameters).ht + 4) = uVar11;
  if (pQVar2 == (QEventPointPrivate *)0x0) {
    pQVar3->rotation = 0.0;
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    pQVar3->rotation = pQVar2->rotation;
    uVar1 = *(undefined8 *)(pQVar2->velocity).v;
    uVar8 = (undefined4)uVar1;
    uVar9 = (undefined4)((ulong)uVar1 >> 0x20);
  }
  *(ulong *)(pQVar3->velocity).v = CONCAT44(uVar9,uVar8);
  pQVar2 = (other->d).d.ptr;
  if (pQVar2 == (QEventPointPrivate *)0x0) {
    qVar6 = -1;
  }
  else {
    qVar6 = (pQVar2->uniqueId).m_numericId;
  }
  (((target->d).d.ptr)->uniqueId).m_numericId = qVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMutableEventPoint::update(const QEventPoint &other, QEventPoint &target)
{
    detach(target);
    setPressure(target, other.pressure());

    switch (other.state()) {
    case QEventPoint::State::Pressed:
        setGlobalPressPosition(target, other.globalPosition());
        setGlobalLastPosition(target, other.globalPosition());
        if (target.pressure() < 0)
            setPressure(target, 1);
        break;

    case QEventPoint::State::Released:
        if (target.globalPosition() != other.globalPosition())
            setGlobalLastPosition(target, target.globalPosition());
        setPressure(target, 0);
        break;

    default: // update or stationary
        if (target.globalPosition() != other.globalPosition())
            setGlobalLastPosition(target, target.globalPosition());
        if (target.pressure() < 0)
            setPressure(target, 1);
        break;
    }

    setState(target, other.state());
    setPosition(target, other.position());
    setScenePosition(target, other.scenePosition());
    setGlobalPosition(target, other.globalPosition());
    setEllipseDiameters(target, other.ellipseDiameters());
    setRotation(target, other.rotation());
    setVelocity(target, other.velocity());
    setUniqueId(target, other.uniqueId()); // for TUIO
}